

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

void __thiscall
cxxopts::option_has_no_value_exception::option_has_no_value_exception
          (option_has_no_value_exception *this,string *option)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  long *plVar3;
  long *plVar4;
  ulong *puVar5;
  ulong *local_a0;
  size_type local_98;
  ulong local_90;
  long lStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  sVar2 = option->_M_string_length;
  if (sVar2 == 0) {
    std::operator+(&local_40,"Option ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (anonymous_namespace)::LQUOTE_abi_cxx11_);
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_40,(ulong)(option->_M_dataplus)._M_p);
    local_80 = &local_70;
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_70 = *plVar4;
      lStack_68 = plVar3[3];
    }
    else {
      local_70 = *plVar4;
      local_80 = (long *)*plVar3;
    }
    local_78 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_80,(anonymous_namespace)::RQUOTE_abi_cxx11_);
    local_60 = &local_50;
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_50 = *plVar4;
      lStack_48 = plVar3[3];
    }
    else {
      local_50 = *plVar4;
      local_60 = (long *)*plVar3;
    }
    local_58 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_60);
    local_a0 = &local_90;
    puVar5 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar5) {
      local_90 = *puVar5;
      lStack_88 = plVar3[3];
    }
    else {
      local_90 = *puVar5;
      local_a0 = (ulong *)*plVar3;
    }
    local_98 = plVar3[1];
    *plVar3 = (long)puVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
  }
  else {
    local_a0 = &local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Option has no value","");
  }
  *(undefined ***)&this->super_OptionException = &PTR__OptionException_00158c70;
  paVar1 = &(this->super_OptionException).m_message.field_2;
  (this->super_OptionException).m_message._M_dataplus._M_p = (pointer)paVar1;
  if (local_a0 == &local_90) {
    paVar1->_M_allocated_capacity = local_90;
    *(long *)((long)&(this->super_OptionException).m_message.field_2 + 8) = lStack_88;
  }
  else {
    (this->super_OptionException).m_message._M_dataplus._M_p = (pointer)local_a0;
    (this->super_OptionException).m_message.field_2._M_allocated_capacity = local_90;
  }
  (this->super_OptionException).m_message._M_string_length = local_98;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  if (sVar2 == 0) {
    local_a0 = &local_90;
    if (local_60 != &local_50) {
      operator_delete(local_60);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  *(undefined ***)&this->super_OptionException = &PTR__OptionException_00159d38;
  return;
}

Assistant:

explicit option_has_no_value_exception(const std::string& option)
    : OptionException(
        option.empty() ?
        ("Option " + LQUOTE + option + RQUOTE + " has no value") :
        "Option has no value")
    {
    }